

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O3

void __thiscall dynet::NamedTimer::show(NamedTimer *this)

{
  long lVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  char local_29;
  
  p_Var3 = (this->cumtimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->cumtimes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      lVar1 = std::cout;
      *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 4;
      *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 0xb;
      poVar2 = std::ostream::_M_insert<double>(*(double *)(p_Var3 + 2));
      local_29 = '\t';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void show() { for (auto &item : cumtimes) { std::cout << std::setprecision(4) << std::setw(11) << item.second << '\t' << item.first << std::endl; } }